

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_lazy_xor(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort key;
  int iVar1;
  byte bVar2;
  uint uVar3;
  roaring_array_t *ra;
  container_t *pcVar4;
  int *c;
  ushort *puVar5;
  roaring_bitmap_t *prVar6;
  uint uVar7;
  int *piVar8;
  ulong uVar9;
  roaring_array_t *prVar10;
  long lVar11;
  uint8_t uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint16_t key_00;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_5b;
  uint8_t local_5a;
  uint8_t local_59;
  ulong local_58;
  roaring_array_t *local_50;
  ulong local_48;
  ulong local_40;
  roaring_array_t *local_38;
  
  local_59 = '\0';
  uVar14 = (x1->high_low_container).size;
  prVar6 = x2;
  if (uVar14 != 0) {
    uVar7 = (x2->high_low_container).size;
    local_48 = (ulong)uVar7;
    prVar6 = x1;
    if (uVar7 != 0) {
      ra = &roaring_bitmap_create_with_capacity(uVar7 + uVar14)->high_low_container;
      bVar2 = 1;
      if (((x1->high_low_container).flags & 1) == 0) {
        bVar2 = (x2->high_low_container).flags & 1;
      }
      ra->flags = ra->flags & 0xfe | bVar2;
      key_00 = *(x1->high_low_container).keys;
      puVar5 = (x2->high_low_container).keys;
      local_58 = 0;
      uVar15 = 0;
      local_50 = &x2->high_low_container;
      local_40 = (ulong)uVar14;
LAB_00105398:
      do {
        key = *puVar5;
        uVar15 = (ulong)(int)uVar15;
        while( true ) {
          prVar10 = local_50;
          iVar13 = (int)uVar15;
          if (key_00 == key) break;
          if (key <= key_00) {
            local_5b = local_50->typecodes[local_58 & 0xffff];
            local_38 = ra;
            pcVar4 = get_copy_of_container
                               (local_50->containers[local_58 & 0xffff],&local_5b,
                                (_Bool)(local_50->flags & 1));
            ra = local_38;
            if ((prVar10->flags & 1) != 0) {
              local_50->containers[(int)local_58] = pcVar4;
              local_50->typecodes[(int)local_58] = local_5b;
            }
            ra_append(local_38,key,pcVar4,local_5b);
            uVar3 = (int)local_58 + 1;
            uVar7 = (uint)local_48;
            if (uVar3 != uVar7) {
              puVar5 = (ushort *)((ulong)((uVar3 & 0xffff) * 2) + (long)local_50->keys);
              local_58 = (ulong)uVar3;
              goto LAB_00105398;
            }
            uVar9 = local_48 & 0xffffffff;
            prVar10 = local_50;
            goto LAB_0010560b;
          }
          local_5a = (x1->high_low_container).typecodes[uVar15 & 0xffff];
          pcVar4 = get_copy_of_container
                             ((x1->high_low_container).containers[uVar15 & 0xffff],&local_5a,
                              (_Bool)((x1->high_low_container).flags & 1));
          if (((x1->high_low_container).flags & 1) != 0) {
            (x1->high_low_container).containers[uVar15] = pcVar4;
            (x1->high_low_container).typecodes[uVar15] = local_5a;
          }
          ra_append(ra,key_00,pcVar4,local_5a);
          if (uVar14 - 1 == iVar13) {
            uVar7 = (uint)local_48;
            prVar10 = local_50;
            uVar9 = local_58;
            goto LAB_001055be;
          }
          uVar15 = uVar15 + 1;
          key_00 = (x1->high_low_container).keys[uVar15 & 0xffff];
        }
        local_5a = (x1->high_low_container).typecodes[uVar15 & 0xffff];
        local_5b = local_50->typecodes[local_58 & 0xffff];
        c = (int *)container_lazy_xor((x1->high_low_container).containers[uVar15 & 0xffff],local_5a,
                                      local_50->containers[local_58 & 0xffff],local_5b,&local_59);
        piVar8 = c;
        uVar12 = local_59;
        if (local_59 == '\x04') {
          uVar12 = (uint8_t)c[2];
          piVar8 = *(int **)c;
        }
        iVar1 = *piVar8;
        if ((uVar12 == '\x03') || (uVar12 == '\x02')) {
          if (iVar1 < 1) goto LAB_00105551;
LAB_0010555e:
          ra_append(ra,key_00,c,local_59);
        }
        else {
          if (iVar1 != 0) {
            if (iVar1 != -1) goto LAB_0010555e;
            lVar11 = 0;
            do {
              if (*(long *)(*(long *)(piVar8 + 2) + lVar11 * 8) != 0) goto LAB_0010555e;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 0x400);
          }
LAB_00105551:
          container_free(c,local_59);
        }
        uVar3 = (int)local_58 + 1;
        uVar9 = (ulong)uVar3;
        uVar7 = (uint)local_48;
        if ((uVar14 - 1 == iVar13) || (uVar3 == uVar7)) {
          uVar15 = (ulong)(iVar13 + 1);
LAB_0010560b:
          uVar14 = (uint)uVar15;
          if (uVar14 == (uint)local_40) {
LAB_001055be:
            local_58 = uVar9;
            bVar2 = prVar10->flags;
            uVar14 = (uint)local_58;
            x1 = (roaring_bitmap_t *)prVar10;
          }
          else {
            if ((uint)uVar9 != uVar7) {
              return (roaring_bitmap_t *)ra;
            }
            bVar2 = (x1->high_low_container).flags;
            uVar7 = (uint)local_40;
          }
          ra_append_copy_range(ra,&x1->high_low_container,uVar14,uVar7,(_Bool)(bVar2 & 1));
          return (roaring_bitmap_t *)ra;
        }
        uVar15 = uVar15 + 1;
        key_00 = (x1->high_low_container).keys[(uint)uVar15 & 0xffff];
        puVar5 = (ushort *)((ulong)((uVar3 & 0xffff) * 2) + (long)prVar10->keys);
        local_58 = uVar9;
      } while( true );
    }
  }
  prVar6 = roaring_bitmap_copy(prVar6);
  return prVar6;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_lazy_xor(const roaring_bitmap_t *x1,
                                          const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) || is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            container_t *c =
                container_lazy_xor(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }

            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}